

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_trainer.cc
# Opt level: O3

string * __thiscall
sentencepiece::SentencePieceNormalizer::Normalize_abi_cxx11_
          (string *__return_storage_ptr__,SentencePieceNormalizer *this,string_view input)

{
  Status local_20 [8];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  (*this->_vptr_SentencePieceNormalizer[7])
            (local_20,this,input._M_len,input._M_str,__return_storage_ptr__);
  sentencepiece::util::Status::IgnoreError();
  sentencepiece::util::Status::~Status(local_20);
  return __return_storage_ptr__;
}

Assistant:

std::string SentencePieceNormalizer::Normalize(absl::string_view input) const {
  std::string normalized;
  Normalize(input, &normalized).IgnoreError();
  return normalized;
}